

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Build_Map.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
Build_Map::Build_Obstacle
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Build_Map *this,
          vector<double,_std::allocator<double>_> *v)

{
  int iVar1;
  double *pdVar2;
  double *pdVar3;
  int *piVar4;
  int iVar5;
  vector<int,_std::allocator<int>_> *pvVar6;
  int iVar7;
  double dVar8;
  initializer_list<int> __l;
  int local_a0;
  undefined4 local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  vector<int,_std::allocator<int>_> *local_88;
  double local_80;
  double local_78;
  double local_70;
  int *local_68;
  double local_60;
  int local_54;
  double local_50;
  double local_48;
  double local_40;
  allocator_type local_31;
  
  pdVar2 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  local_48 = pdVar2[1];
  pdVar3 = (this->Boundary).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (this->World).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_80 = *pdVar3;
  local_60 = pdVar3[1];
  local_40 = this->margin;
  local_50 = this->xy_res;
  local_88 = __return_storage_ptr__;
  dVar8 = floor(((*pdVar2 - local_80) - local_40) / local_50);
  local_54 = (int)dVar8;
  if (local_54 < 1) {
    local_54 = 0;
  }
  dVar8 = floor(((local_48 - local_60) - local_40) / local_50);
  iVar7 = (int)dVar8;
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  local_48 = (double)CONCAT44(local_48._4_4_,iVar7);
  local_78 = pdVar3[2];
  local_70 = this->z_res;
  dVar8 = floor(((pdVar2[2] - local_78) - local_40) / local_70);
  iVar7 = 0;
  if (0 < (int)dVar8) {
    iVar7 = (int)dVar8;
  }
  dVar8 = ceil(((pdVar2[3] - local_80) + local_40) / local_50);
  iVar1 = piVar4[1];
  iVar5 = (int)dVar8;
  if (*piVar4 < (int)dVar8) {
    iVar5 = *piVar4;
  }
  local_68 = piVar4;
  dVar8 = ceil(((pdVar2[4] - local_60) + local_40) / local_50);
  local_90 = (int)dVar8;
  if (iVar1 < (int)dVar8) {
    local_90 = iVar1;
  }
  dVar8 = ceil(((pdVar2[5] - local_78) + local_40) / local_70);
  pvVar6 = local_88;
  local_8c = (int)dVar8;
  if (local_68[2] < (int)dVar8) {
    local_8c = local_68[2];
  }
  local_a0 = local_54;
  local_9c = local_48._0_4_;
  __l._M_len = 6;
  __l._M_array = &local_a0;
  local_98 = iVar7;
  local_94 = iVar5;
  std::vector<int,_std::allocator<int>_>::vector(local_88,__l,&local_31);
  return pvVar6;
}

Assistant:

std::vector<int> Build_Map::Build_Obstacle(std::vector<double> v) {
  int minx = std::max(
      static_cast<int>(std::floor(((v[0] - Boundary[0] - margin) / xy_res))),
      0);
  int miny = std::max(
      static_cast<int>(std::floor(((v[1] - Boundary[1] - margin) / xy_res))),
      0);
  int minz = std::max(
      static_cast<int>(std::floor(((v[2] - Boundary[2] - margin) / z_res))), 0);
  int maxx = std::min(
      static_cast<int>(std::ceil(((v[3] - Boundary[0] + margin) / xy_res))),
      World[0]);
  int maxy = std::min(
      static_cast<int>(std::ceil(((v[4] - Boundary[1] + margin) / xy_res))),
      World[1]);
  int maxz = std::min(
      static_cast<int>(std::ceil(((v[5] - Boundary[2] + margin) / z_res))),
      World[2]);
  std::vector<int> Obstacle_Extrema = { minx, miny, minz, maxx, maxy, maxz };
  return Obstacle_Extrema;
}